

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::GetBooleanValueOld
          (cmConditionEvaluator *this,cmExpandedCommandArgument *arg,bool one)

{
  char *__nptr;
  __type _Var1;
  bool bVar2;
  int iVar3;
  char *val;
  undefined7 in_register_00000011;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((int)CONCAT71(in_register_00000011,one) == 0) {
    val = GetDefinitionIfUnquoted(this,arg);
    if (val == (char *)0x0) {
      __nptr = (arg->Value)._M_dataplus._M_p;
      iVar3 = atoi(__nptr);
      val = (char *)0x0;
      if (iVar3 != 0) {
        val = __nptr;
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_40,"0",&local_41);
    _Var1 = std::operator==(&arg->Value,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (_Var1) {
      return false;
    }
    std::__cxx11::string::string((string *)&local_40,"1",&local_41);
    _Var1 = std::operator==(&arg->Value,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (_Var1) {
      return true;
    }
    val = GetDefinitionIfUnquoted(this,arg);
  }
  bVar2 = cmSystemTools::IsOff(val);
  return !bVar2;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueOld(
  cmExpandedCommandArgument const& arg, bool one) const
{
  if(one)
    {
    // Old IsTrue behavior for single argument.
    if(arg == "0")
      { return false; }
    else if(arg == "1")
      { return true; }
    else
      {
      const char* def = this->GetDefinitionIfUnquoted(arg);
      return !cmSystemTools::IsOff(def);
      }
    }
  else
    {
    // Old GetVariableOrNumber behavior.
    const char* def = this->GetDefinitionIfUnquoted(arg);
    if(!def && atoi(arg.c_str()))
      {
      def = arg.c_str();
      }
    return !cmSystemTools::IsOff(def);
    }
}